

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

void __thiscall CVmObjClass::save_to_file(CVmObjClass *this,CVmFile *fp)

{
  vm_intcls_ext *buf_00;
  CVmFile *in_RSI;
  CVmObjClass *in_RDI;
  char buf [5];
  vm_intcls_ext *ext;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  CVmFile *in_stack_ffffffffffffffe0;
  
  buf_00 = get_ext(in_RDI);
  CVmFile::write_uint2(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmFile::write_uint2(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmFile::write_uint4(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  vmb_put_dh((char *)in_stack_ffffffffffffffe0,
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  CVmFile::write_bytes(in_RSI,(char *)buf_00,(size_t)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void CVmObjClass::save_to_file(VMG_ class CVmFile *fp)
{
    /* write our data: data size, meta table index, mod ID, class state */
    vm_intcls_ext *ext = get_ext();
    fp->write_uint2(2 + 2 + 4 + VMB_DATAHOLDER);
    fp->write_uint2(ext->meta_idx);
    fp->write_uint4(ext->mod_obj);

    char buf[VMB_DATAHOLDER];
    vmb_put_dh(buf, &ext->class_state);
    fp->write_bytes(buf, VMB_DATAHOLDER);
}